

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O0

void testProcrustesImp<double>(void)

{
  long lVar1;
  bool bVar2;
  double dVar3;
  double b;
  double c;
  undefined1 auVar4 [16];
  Eulerd rot2;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *in_stack_000001d8;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *in_stack_000001e0;
  Eulerd rot;
  size_t i_1;
  size_t numPoints;
  Rand48 random;
  double theta;
  size_t i;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> toPoints;
  vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> fromPoints;
  M44d m;
  M44d id;
  Vec3<double> *in_stack_fffffffffffff888;
  Matrix44<double> *in_stack_fffffffffffff890;
  Matrix44<double> *pMVar5;
  Matrix44<double> *in_stack_fffffffffffff8a0;
  Matrix44<double> *v;
  Matrix44<double> *in_stack_fffffffffffff8a8;
  double in_stack_fffffffffffff8b0;
  double in_stack_fffffffffffff8b8;
  Euler<double> *in_stack_fffffffffffff8c0;
  Vec3<double> *in_stack_fffffffffffff8e8;
  Matrix44<double> *in_stack_fffffffffffff8f0;
  Vec3<double> local_708;
  Vec3<double> local_6f0;
  Vec3<double> local_6d8 [2];
  M44d *in_stack_fffffffffffff960;
  Euler<double> *in_stack_fffffffffffff9b8;
  Matrix44<double> local_640;
  Vec3<double> local_5a0 [3];
  Vec3<double> *in_stack_fffffffffffffaa8;
  Matrix44<double> *in_stack_fffffffffffffab0;
  M44d *in_stack_fffffffffffffb50;
  M44d *in_stack_fffffffffffffb80;
  Vec3<double> local_468;
  Vec3<double> local_450;
  Vec3<double> local_438;
  Vec3<double> local_420;
  ulong local_408;
  ulong local_400;
  Vec3<double> local_3f0;
  Vec3<double> local_3c8;
  double local_3b0;
  ulong local_3a8;
  Vec3<double> local_370;
  Vec3<double> local_358;
  Vec3<double> local_340;
  Vec3<double> local_328;
  Vec3<double> local_310;
  Vec3<double> local_2f8;
  Vec3<double> local_2e0;
  Vec3<double> local_2c8;
  Vec3<double> local_2b0;
  Vec3<double> local_298;
  Matrix44<double> local_280;
  Matrix44<double> local_200;
  Matrix44<double> local_180;
  Matrix44<double> local_100;
  Matrix44<double> local_80;
  
  Imath_2_5::procrustesRotationAndTranslation<double>
            ((Vec3 *)&local_80,(Vec3 *)0x0,(double *)0x0,0,false);
  Imath_2_5::Matrix44<double>::Matrix44(in_stack_fffffffffffff890);
  bVar2 = Imath_2_5::Matrix44<double>::operator==(&local_80,&local_100);
  if (!bVar2) {
    __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                  ,0x127,"void testProcrustesImp() [T = double]");
  }
  Imath_2_5::procrustesRotationAndTranslation<double>((Vec3 *)&local_180,(Vec3 *)0x0,0,false);
  Imath_2_5::Matrix44<double>::operator=(&local_80,&local_180);
  Imath_2_5::Matrix44<double>::Matrix44(in_stack_fffffffffffff890);
  bVar2 = Imath_2_5::Matrix44<double>::operator==(&local_80,&local_200);
  if (!bVar2) {
    __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testProcrustes.cpp"
                  ,300,"void testProcrustesImp() [T = double]");
  }
  Imath_2_5::Matrix44<double>::Matrix44(in_stack_fffffffffffff890);
  Imath_2_5::Matrix44<double>::makeIdentity(in_stack_fffffffffffff890);
  testTranslationRotationMatrix<double>(in_stack_fffffffffffffb80);
  Imath_2_5::Vec3<double>::Vec3(&local_298,3.0,5.0,-0.2);
  Imath_2_5::Matrix44<double>::translate<double>
            (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  testTranslationRotationMatrix<double>(in_stack_fffffffffffffb80);
  Imath_2_5::Vec3<double>::Vec3(&local_2b0,3.141592653589793,0.0,0.0);
  Imath_2_5::Matrix44<double>::rotate<double>(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  testTranslationRotationMatrix<double>(in_stack_fffffffffffffb80);
  Imath_2_5::Vec3<double>::Vec3(&local_2c8,0.0,0.7853981633974483,0.0);
  Imath_2_5::Matrix44<double>::rotate<double>(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  testTranslationRotationMatrix<double>(in_stack_fffffffffffffb80);
  Imath_2_5::Vec3<double>::Vec3(&local_2e0,0.0,0.0,-2.356194490192345);
  Imath_2_5::Matrix44<double>::rotate<double>(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  testTranslationRotationMatrix<double>(in_stack_fffffffffffffb80);
  Imath_2_5::Matrix44<double>::makeIdentity(in_stack_fffffffffffff890);
  testWithTranslateRotateAndScale<double>(in_stack_fffffffffffffb50);
  Imath_2_5::Vec3<double>::Vec3(&local_2f8,0.4,6.0,10.0);
  Imath_2_5::Matrix44<double>::translate<double>
            (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  testWithTranslateRotateAndScale<double>(in_stack_fffffffffffffb50);
  Imath_2_5::Vec3<double>::Vec3(&local_310,3.141592653589793,0.0,0.0);
  Imath_2_5::Matrix44<double>::rotate<double>(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  testWithTranslateRotateAndScale<double>(in_stack_fffffffffffffb50);
  Imath_2_5::Vec3<double>::Vec3(&local_328,0.0,0.7853981633974483,0.0);
  Imath_2_5::Matrix44<double>::rotate<double>(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  testWithTranslateRotateAndScale<double>(in_stack_fffffffffffffb50);
  Imath_2_5::Vec3<double>::Vec3(&local_340,0.0,0.0,-2.356194490192345);
  Imath_2_5::Matrix44<double>::rotate<double>(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  testWithTranslateRotateAndScale<double>(in_stack_fffffffffffffb50);
  Imath_2_5::Vec3<double>::Vec3(&local_358,2.0,2.0,2.0);
  Imath_2_5::Matrix44<double>::scale<double>(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  testWithTranslateRotateAndScale<double>(in_stack_fffffffffffffb50);
  Imath_2_5::Vec3<double>::Vec3(&local_370,0.01,0.01,0.01);
  Imath_2_5::Matrix44<double>::scale<double>(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  testWithTranslateRotateAndScale<double>(in_stack_fffffffffffffb50);
  std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::vector
            ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)0x17415a)
  ;
  std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::vector
            ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)0x174167)
  ;
  std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::clear
            ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)0x174174)
  ;
  std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::clear
            ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)0x174181)
  ;
  for (local_3a8 = 0; local_3a8 < 4; local_3a8 = local_3a8 + 1) {
    lVar1 = local_3a8 * 2;
    auVar4._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar4._0_8_ = lVar1;
    auVar4._12_4_ = 0x45300000;
    local_3b0 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) / 3.141592653589793;
    in_stack_fffffffffffff8f0 = (Matrix44<double> *)cos(local_3b0);
    dVar3 = sin(local_3b0);
    Imath_2_5::Vec3<double>::Vec3(&local_3c8,(double)in_stack_fffffffffffff8f0,dVar3,0.0);
    std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::push_back
              ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)
               in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    in_stack_fffffffffffff8e8 = (Vec3<double> *)cos(local_3b0 + 1.0471975511965976);
    dVar3 = sin(local_3b0 + 1.0471975511965976);
    Imath_2_5::Vec3<double>::Vec3(&local_3f0,(double)in_stack_fffffffffffff8e8,dVar3,0.0);
    std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::push_back
              ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)
               in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  }
  verifyProcrustes<double>(in_stack_000001e0,in_stack_000001d8);
  Imath_2_5::Rand48::Rand48
            ((Rand48 *)in_stack_fffffffffffff890,(unsigned_long)in_stack_fffffffffffff888);
  for (local_400 = 1; local_400 < 10; local_400 = local_400 + 1) {
    std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::clear
              ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)
               0x174348);
    std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::clear
              ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)
               0x174355);
    for (local_408 = 0; local_408 < local_400; local_408 = local_408 + 1) {
      dVar3 = Imath_2_5::Rand48::nextf((Rand48 *)0x174384);
      b = Imath_2_5::Rand48::nextf((Rand48 *)0x174399);
      c = Imath_2_5::Rand48::nextf((Rand48 *)0x1743ae);
      Imath_2_5::Vec3<double>::Vec3(&local_420,dVar3,b,c);
      std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::push_back
                ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)
                 in_stack_fffffffffffff890,in_stack_fffffffffffff888);
      in_stack_fffffffffffff8c0 = (Euler<double> *)Imath_2_5::Rand48::nextf((Rand48 *)0x1743fb);
      in_stack_fffffffffffff8b8 = Imath_2_5::Rand48::nextf((Rand48 *)0x174410);
      in_stack_fffffffffffff8b0 = Imath_2_5::Rand48::nextf((Rand48 *)0x174425);
      Imath_2_5::Vec3<double>::Vec3
                (&local_438,(double)in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,
                 in_stack_fffffffffffff8b0);
      std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::push_back
                ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)
                 in_stack_fffffffffffff890,in_stack_fffffffffffff888);
    }
  }
  verifyProcrustes<double>(in_stack_000001e0,in_stack_000001d8);
  testProcrustesWithMatrix<double>(in_stack_fffffffffffff960);
  Imath_2_5::Vec3<double>::Vec3(&local_450,3.0,4.0,1.0);
  Imath_2_5::Matrix44<double>::translate<double>
            (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  testProcrustesWithMatrix<double>(in_stack_fffffffffffff960);
  Imath_2_5::Vec3<double>::Vec3(&local_468,-10.0,2.0,1.0);
  Imath_2_5::Matrix44<double>::translate<double>
            (in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  testProcrustesWithMatrix<double>(in_stack_fffffffffffff960);
  Imath_2_5::Euler<double>::Euler
            (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
             (double)in_stack_fffffffffffff8a8,(Order)((ulong)in_stack_fffffffffffff8a0 >> 0x20),
             (InputLayout)in_stack_fffffffffffff8a0);
  Imath_2_5::Euler<double>::toMatrix44(in_stack_fffffffffffff9b8);
  Imath_2_5::Matrix44<double>::operator*(in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
  pMVar5 = &local_280;
  Imath_2_5::Matrix44<double>::operator=(pMVar5,(Matrix44<double> *)&stack0xfffffffffffffaf8);
  testProcrustesWithMatrix<double>(in_stack_fffffffffffff960);
  Imath_2_5::Vec3<double>::Vec3(local_5a0,1.5,6.4,2.0);
  v = &local_280;
  Imath_2_5::Matrix44<double>::scale<double>(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  testProcrustesWithMatrix<double>(in_stack_fffffffffffff960);
  Imath_2_5::Euler<double>::Euler
            (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,
             (double)pMVar5,(Order)((ulong)v >> 0x20),(InputLayout)v);
  Imath_2_5::Euler<double>::toMatrix44(in_stack_fffffffffffff9b8);
  Imath_2_5::Matrix44<double>::operator*(pMVar5,v);
  Imath_2_5::Matrix44<double>::operator=(&local_280,&local_640);
  Imath_2_5::Vec3<double>::Vec3(local_6d8,-1.0,1.0,1.0);
  Imath_2_5::Matrix44<double>::scale<double>(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
  testProcrustesWithMatrix<double>(in_stack_fffffffffffff960);
  Imath_2_5::Vec3<double>::Vec3(&local_6f0,1.0,0.001,1.0);
  pMVar5 = &local_280;
  Imath_2_5::Matrix44<double>::scale<double>(pMVar5,in_stack_fffffffffffff888);
  testProcrustesWithMatrix<double>(in_stack_fffffffffffff960);
  Imath_2_5::Vec3<double>::Vec3(&local_708,1.0,1.0,0.0);
  Imath_2_5::Matrix44<double>::scale<double>(pMVar5,(Vec3<double> *)&local_280);
  testProcrustesWithMatrix<double>(in_stack_fffffffffffff960);
  std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::~vector
            ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)v);
  std::vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_>::~vector
            ((vector<Imath_2_5::Vec3<double>,_std::allocator<Imath_2_5::Vec3<double>_>_> *)v);
  return;
}

Assistant:

void
testProcrustesImp ()
{
    // Test the empty case:
    IMATH_INTERNAL_NAMESPACE::M44d id = 
        procrustesRotationAndTranslation ((IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0, 
                                          (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
                                          (T*) 0,
                                          0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d());

    id = procrustesRotationAndTranslation ((IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0, 
                                           (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
                                           0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d());

    // First we'll test with a bunch of known translation/rotation matrices
    // to make sure we get back exactly the same points:
    IMATH_INTERNAL_NAMESPACE::M44d m;
    m.makeIdentity();
    testTranslationRotationMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d(3.0, 5.0, -0.2));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(M_PI, 0, 0));
    testTranslationRotationMatrix<T> (m);
    
    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, M_PI/4.0, 0));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, 0, -3.0/4.0 * M_PI));
    testTranslationRotationMatrix<T> (m);

    m.makeIdentity();
    testWithTranslateRotateAndScale<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d(0.4, 6.0, 10.0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(M_PI, 0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, M_PI/4.0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d(0, 0, -3.0/4.0 * M_PI));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d(2.0, 2.0, 2.0));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d(0.01, 0.01, 0.01));
    testWithTranslateRotateAndScale<T> (m);

    // Now we'll test with some random point sets and verify
    // the various Procrustes properties:
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > fromPoints;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T> > toPoints;
    fromPoints.clear(); toPoints.clear();

    for (size_t i = 0; i < 4; ++i)
    {
        const T theta = T(2*i) / T(M_PI);
        fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(cos(theta), sin(theta), 0));
        toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(cos(theta + M_PI/3.0), sin(theta + M_PI/3.0), 0));
    }
    verifyProcrustes (fromPoints, toPoints);

    IMATH_INTERNAL_NAMESPACE::Rand48 random (1209);
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        fromPoints.clear(); toPoints.clear();
        for (size_t i = 0; i < numPoints; ++i)
        {
            fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(random.nextf(), random.nextf(), random.nextf()));
            toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T>(random.nextf(), random.nextf(), random.nextf()));
        }
    }
    verifyProcrustes (fromPoints, toPoints);

    // Test with some known matrices of varying degrees of quality:
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T>(3, 4, 1));
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T>(-10, 2, 1));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot (M_PI/3.0, 3.0*M_PI/4.0, 0);
    m = m * rot.toMatrix44();
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1.5, 6.4, 2.0));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot2 (1.0, M_PI, M_PI/3.0);
    m = m * rot.toMatrix44();

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(-1, 1, 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1, 0.001, 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T>(1, 1, 0));
    testProcrustesWithMatrix<T> (m);
}